

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O3

void __thiscall QCacheItem::writeCompressedData(QCacheItem *this,QFileDevice *device)

{
  long lVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  QByteArray local_50;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_38,(QIODevice *)device);
  lVar1 = QBuffer::data();
  puVar2 = *(undefined8 **)(lVar1 + 8);
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = &QByteArray::_empty;
  }
  qCompress((uchar *)&local_50,(longlong)puVar2,(int)*(undefined8 *)(lVar1 + 0x10));
  ::operator<<((QDataStream *)&local_38,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
    }
  }
  QDataStream::~QDataStream((QDataStream *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCacheItem::writeCompressedData(QFileDevice *device) const
{
    QDataStream out(device);

    out << qCompress(data.data());
}